

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind.c
# Opt level: O3

RewindBuffer * rewind_new(RewindInit *init,Emulator *e)

{
  size_t __size;
  int iVar1;
  undefined4 uVar2;
  RewindBuffer *buf;
  u8 *puVar3;
  
  buf = (RewindBuffer *)malloc(0xa8);
  memset(buf->data_range,0,0x98);
  iVar1 = init->frames_per_base_state;
  uVar2 = *(undefined4 *)&init->field_0xc;
  (buf->init).buffer_capacity = init->buffer_capacity;
  (buf->init).frames_per_base_state = iVar1;
  *(undefined4 *)&(buf->init).field_0xc = uVar2;
  __size = init->buffer_capacity;
  puVar3 = (u8 *)malloc(__size);
  emulator_init_state_file_data(&buf->last_state);
  emulator_init_state_file_data(&buf->last_base_state);
  emulator_init_state_file_data(&buf->rewind_diff_state);
  buf->last_base_state_ticks = 0xffffffffffffffff;
  buf->data_range[0].end = puVar3;
  buf->data_range[0].begin = puVar3;
  buf->data_range[1].begin = buf->data_range[0].begin;
  buf->data_range[1].end = buf->data_range[0].end;
  buf->info_range[0].end = (RewindInfo *)(puVar3 + __size);
  buf->info_range[0].begin = (RewindInfo *)(puVar3 + __size);
  buf->info_range[1].begin = buf->info_range[0].begin;
  buf->info_range[1].end = buf->info_range[0].end;
  buf->frames_until_next_base = 0;
  rewind_append(buf,e);
  return buf;
}

Assistant:

RewindBuffer* rewind_new(const RewindInit* init, Emulator* e) {
  RewindBuffer* buffer = xmalloc(sizeof(RewindBuffer));
  ZERO_MEMORY(*buffer);
  buffer->init = *init;

  size_t capacity = init->buffer_capacity;
  u8* data = xmalloc(capacity);
  emulator_init_state_file_data(&buffer->last_state);
  emulator_init_state_file_data(&buffer->last_base_state);
  emulator_init_state_file_data(&buffer->rewind_diff_state);
  buffer->last_base_state_ticks = INVALID_TICKS;
  buffer->data_range[0].begin = buffer->data_range[0].end = data;
  buffer->data_range[1] = buffer->data_range[0];
  RewindInfo* info = (RewindInfo*)(data + capacity);
  buffer->info_range[0].begin = buffer->info_range[0].end = info;
  buffer->info_range[1] = buffer->info_range[0];
  buffer->frames_until_next_base = 0;

  rewind_append(buffer, e);

  return buffer;
}